

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QByteArray * QtPrivate::convertToUtf8(QByteArray *__return_storage_ptr__,QLatin1StringView string)

{
  Data *pDVar1;
  char *pcVar2;
  char *in_RCX;
  __off_t extraout_RDX_00;
  __off_t __length;
  QLatin1StringView in;
  __off_t extraout_RDX;
  
  in.m_size = string.m_data;
  if (in.m_size == (char *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(__return_storage_ptr__,(long)string.m_size * 2,Uninitialized);
    pDVar1 = (__return_storage_ptr__->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
    }
    in.m_data = in_RCX;
    pcVar2 = QUtf8::convertFromLatin1
                       ((QUtf8 *)(__return_storage_ptr__->d).ptr,(char *)string.m_size,in);
    pDVar1 = (__return_storage_ptr__->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (__length = extraout_RDX,
       1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
      __length = extraout_RDX_00;
    }
    QByteArray::truncate
              (__return_storage_ptr__,pcVar2 + -(long)(__return_storage_ptr__->d).ptr,__length);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QtPrivate::convertToUtf8(QLatin1StringView string)
{
    if (Q_UNLIKELY(string.isNull()))
        return QByteArray();

    // create a QByteArray with the worst case scenario size
    QByteArray ba(string.size() * 2, Qt::Uninitialized);
    const qsizetype sz = QUtf8::convertFromLatin1(ba.data(), string) - ba.data();
    ba.truncate(sz);

    return ba;
}